

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O0

boolean replay_run_cmdloop(boolean optonly,boolean singlestep,boolean fast)

{
  char cVar1;
  nh_option_desc *pnVar2;
  char *pcVar3;
  boolean local_39;
  boolean did_action;
  nh_option_desc *tmp;
  nh_cmd_arg cmdarg;
  int cmdidx;
  int count;
  char *token;
  char *cmd;
  boolean fast_local;
  boolean singlestep_local;
  boolean optonly_local;
  
  pnVar2 = birth_options;
  local_39 = '\0';
  birth_options = active_birth_options;
  active_birth_options = pnVar2;
  cmd._5_1_ = fast;
  cmd._6_1_ = singlestep;
  cmd._7_1_ = optonly;
  pcVar3 = next_log_token();
  _cmdidx = strdupnull(pcVar3);
  do {
    pnVar2 = birth_options;
    if (_cmdidx == (char *)0x0) {
      birth_options = active_birth_options;
      active_birth_options = pnVar2;
      return local_39;
    }
    cVar1 = *_cmdidx;
    if (cVar1 == '!') {
      replay_read_option(_cmdidx);
    }
    else if (cVar1 == '-') {
      if (((program_state.viewing != 0) && (loginfo.cmds_are_invalid != '\0')) &&
         (cmd._7_1_ == '\0')) {
        replay_check_msg(_cmdidx);
      }
    }
    else if (cVar1 == '<') {
      if (cmd._7_1_ == '\0') {
        replay_check_cmdresult(_cmdidx);
      }
    }
    else if (cVar1 == '>') {
      if ((cmd._7_1_ == '\0') && (loginfo.cmds_are_invalid == '\0')) {
        replay_read_command(_cmdidx,&token,&cmdarg.field_1.d,(nh_cmd_arg *)&tmp);
        cmdarg.argtype = get_command_idx(token);
        command_input(cmdarg.argtype,cmdarg.field_1.d,(nh_cmd_arg *)&tmp);
      }
      if (cmd._7_1_ == '\0') {
        local_39 = '\x01';
      }
    }
    else if (cVar1 == 'T') {
      replay_read_timezone(_cmdidx);
    }
    else if (cVar1 == '~') {
      if ((cmd._7_1_ == '\0') || (cmd._6_1_ != '\0')) {
        pcVar3 = next_log_token();
        replay_check_diff(pcVar3,cmd._7_1_,cmd._5_1_);
      }
      pnVar2 = active_birth_options;
      if (cmd._6_1_ != '\0') {
        active_birth_options = birth_options;
        birth_options = pnVar2;
        return local_39;
      }
    }
    free(_cmdidx);
    pcVar3 = next_log_token();
    _cmdidx = strdupnull(pcVar3);
  } while( true );
}

Assistant:

boolean replay_run_cmdloop(boolean optonly, boolean singlestep, boolean fast)
{
    char *cmd, *token;
    int count, cmdidx;
    struct nh_cmd_arg cmdarg;
    struct nh_option_desc *tmp;
    boolean did_action = FALSE;
    
    /* the log contains the birth options that are required for this game,
     * so nh_set_option calls during the replay must change active_birth_options */
    tmp = birth_options;
    birth_options = active_birth_options;
    active_birth_options = tmp;

    token = strdupnull(next_log_token());

    while (token) {
	switch (token[0]) {
	    case '!': /* Option */
		replay_read_option(token);
		break;
		
	    case 'T': /* timezone offset */
		replay_read_timezone(token);
		break;
		
	    case '>': /* command */
		if (!optonly && !loginfo.cmds_are_invalid) {
		    replay_read_command(token, &cmd, &count, &cmdarg);
		    cmdidx = get_command_idx(cmd);
		    command_input(cmdidx, count, &cmdarg);
		}
		if (!optonly)
		    did_action = TRUE;
		break;
		
	    case '<': /* a command result */
		if (!optonly)
		    replay_check_cmdresult(token);
		break;

	    case '~': /* a diff */
		if (!optonly || singlestep)
		    replay_check_diff(next_log_token(), optonly, fast);
		if (singlestep)
		    goto out;
		break;

	    case '-': /* a message */
		/* We want to display the welcome messages in the
		 * new-game sequence even if recovering from diffs. */
		if (program_state.viewing && loginfo.cmds_are_invalid && !optonly)
		    replay_check_msg(token);
		break;
	}
	free(token);
	token = strdupnull(next_log_token());
    }

out:
    /* return the birth options to normal */
    tmp = birth_options;
    birth_options = active_birth_options;
    active_birth_options = tmp;
    
    return did_action;
}